

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::SegmentBTree::SwapSegment
          (SegmentBTree *this,uint32 originalKey,SparseArraySegmentBase *oldSeg,
          SparseArraySegmentBase *newSeg)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint **ppuVar5;
  SparseArraySegmentBase ***pppSVar6;
  undefined4 *puVar7;
  SegmentBTree **ppSVar8;
  uint local_30;
  uint32 i;
  uint32 itemIndex;
  SparseArraySegmentBase *newSeg_local;
  SparseArraySegmentBase *oldSeg_local;
  uint32 originalKey_local;
  SegmentBTree *this_local;
  
  for (local_30 = 0; local_30 < this->segmentCount; local_30 = local_30 + 1) {
    ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__((WriteBarrierPtr *)this);
    uVar1 = (*ppuVar5)[local_30];
    pppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                         ((WriteBarrierPtr *)&this->segments);
    if ((uVar1 != (*pppSVar6)[local_30]->left) &&
       ((oldSeg != newSeg ||
        (pppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                              ((WriteBarrierPtr *)&this->segments), newSeg != (*pppSVar6)[local_30])
        ))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0xd7,
                                  "(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]))"
                                  ,
                                  "keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i])"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__((WriteBarrierPtr *)this);
    if (originalKey < (*ppuVar5)[local_30]) break;
  }
  if ((local_30 == 0) ||
     (pppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                           ((WriteBarrierPtr *)&this->segments), oldSeg != (*pppSVar6)[local_30 - 1]
     )) {
    BVar4 = IsLeaf(this);
    if (BVar4 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0xea,"(!IsLeaf())","!IsLeaf()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppSVar8 = Memory::WriteBarrierPtr::operator_cast_to_SegmentBTree__
                        ((WriteBarrierPtr *)&this->children);
    SwapSegment(*ppSVar8 + local_30,originalKey,oldSeg,newSeg);
  }
  else {
    pppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase___
                         ((WriteBarrierPtr *)&this->segments);
    (*pppSVar6)[local_30 - 1] = newSeg;
    uVar1 = newSeg->left;
    ppuVar5 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__((WriteBarrierPtr *)this);
    (*ppuVar5)[local_30 - 1] = uVar1;
  }
  return;
}

Assistant:

void SegmentBTree::SwapSegment(uint32 originalKey, SparseArraySegmentBase* oldSeg, SparseArraySegmentBase* newSeg)
    {
        // Find old segment
        uint32 itemIndex = originalKey;
        uint32 i = 0;

        for(; i < segmentCount; i++)
        {
            Assert(keys[i] == segments[i]->left || (oldSeg == newSeg && newSeg == segments[i]));
            if (itemIndex <  keys[i])
            {
                break;
            }
        }

        // i is 1 past any match

        if (i > 0)
        {
            if (oldSeg == segments[i-1])
            {
                segments[i-1] = newSeg;
                keys[i-1] = newSeg->left;
                return;
            }
        }

        Assert(!IsLeaf());
        children[i].SwapSegment(originalKey, oldSeg, newSeg);
    }